

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void ComplexMask_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh,int ithresh,
                     __m128i *mask)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 auVar17 [16];
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  __m128i filter_mask;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  uint local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  uVar20 = (undefined1)((uint)ithresh >> 0x18);
  uVar19 = (undefined1)((uint)ithresh >> 0x10);
  uVar18 = (undefined1)((uint)ithresh >> 8);
  auVar17._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,ithresh)) >> 0x20);
  auVar17[3] = uVar18;
  auVar17[2] = uVar18;
  auVar17[0] = (undefined1)ithresh;
  auVar17[1] = auVar17[0];
  auVar17._8_8_ = 0;
  auVar17 = pshuflw(auVar17,auVar17,0);
  bVar21 = auVar17[0];
  bVar22 = auVar17[1];
  bVar23 = auVar17[2];
  bVar24 = auVar17[3];
  bVar1 = (byte)(*mask)[0];
  bVar2 = *(byte *)((long)*mask + 1);
  bVar3 = *(byte *)((long)*mask + 2);
  bVar4 = *(byte *)((long)*mask + 3);
  bVar5 = *(byte *)((long)*mask + 4);
  bVar6 = *(byte *)((long)*mask + 5);
  bVar7 = *(byte *)((long)*mask + 6);
  bVar8 = *(byte *)((long)*mask + 7);
  bVar9 = (byte)(*mask)[1];
  bVar10 = *(byte *)((long)*mask + 9);
  bVar11 = *(byte *)((long)*mask + 10);
  bVar12 = *(byte *)((long)*mask + 0xb);
  bVar13 = *(byte *)((long)*mask + 0xc);
  bVar14 = *(byte *)((long)*mask + 0xd);
  bVar15 = *(byte *)((long)*mask + 0xe);
  bVar16 = *(byte *)((long)*mask + 0xf);
  local_38 = CONCAT13(-((byte)((bVar4 < bVar24) * bVar4 | (bVar4 >= bVar24) * bVar24) == bVar4),
                      CONCAT12(-((byte)((bVar3 < bVar23) * bVar3 | (bVar3 >= bVar23) * bVar23) ==
                                bVar3),CONCAT11(-((byte)((bVar2 < bVar22) * bVar2 |
                                                        (bVar2 >= bVar22) * bVar22) == bVar2),
                                                -((byte)((bVar1 < bVar21) * bVar1 |
                                                        (bVar1 >= bVar21) * bVar21) == bVar1))));
  uStack_34 = CONCAT13(-((byte)((bVar8 < bVar24) * bVar8 | (bVar8 >= bVar24) * bVar24) == bVar8),
                       CONCAT12(-((byte)((bVar7 < bVar23) * bVar7 | (bVar7 >= bVar23) * bVar23) ==
                                 bVar7),CONCAT11(-((byte)((bVar6 < bVar22) * bVar6 |
                                                         (bVar6 >= bVar22) * bVar22) == bVar6),
                                                 -((byte)((bVar5 < bVar21) * bVar5 |
                                                         (bVar5 >= bVar21) * bVar21) == bVar5))));
  uStack_30 = CONCAT13(-((byte)((bVar12 < bVar24) * bVar12 | (bVar12 >= bVar24) * bVar24) == bVar12)
                       ,CONCAT12(-((byte)((bVar11 < bVar23) * bVar11 | (bVar11 >= bVar23) * bVar23)
                                  == bVar11),
                                 CONCAT11(-((byte)((bVar10 < bVar22) * bVar10 |
                                                  (bVar10 >= bVar22) * bVar22) == bVar10),
                                          -((byte)((bVar9 < bVar21) * bVar9 |
                                                  (bVar9 >= bVar21) * bVar21) == bVar9))));
  uStack_2c = CONCAT13(-((byte)((bVar16 < bVar24) * bVar16 | (bVar16 >= bVar24) * bVar24) == bVar16)
                       ,CONCAT12(-((byte)((bVar15 < bVar23) * bVar15 | (bVar15 >= bVar23) * bVar23)
                                  == bVar15),
                                 CONCAT11(-((byte)((bVar14 < bVar22) * bVar14 |
                                                  (bVar14 >= bVar22) * bVar22) == bVar14),
                                          -((byte)((bVar13 < bVar21) * bVar13 |
                                                  (bVar13 >= bVar21) * bVar21) == bVar13))));
  NeedsFilter_SSE2(p1,p0,q0,q1,thresh,(__m128i *)&local_28);
  *(uint *)*mask = local_38 & local_28;
  *(uint *)((long)*mask + 4) = uStack_34 & uStack_24;
  *(uint *)(*mask + 1) = uStack_30 & uStack_20;
  *(uint *)((long)*mask + 0xc) = uStack_2c & uStack_1c;
  return;
}

Assistant:

static WEBP_INLINE void ComplexMask_SSE2(const __m128i* const p1,
                                         const __m128i* const p0,
                                         const __m128i* const q0,
                                         const __m128i* const q1,
                                         int thresh, int ithresh,
                                         __m128i* const mask) {
  const __m128i it = _mm_set1_epi8(ithresh);
  const __m128i diff = _mm_subs_epu8(*mask, it);
  const __m128i thresh_mask = _mm_cmpeq_epi8(diff, _mm_setzero_si128());
  __m128i filter_mask;
  NeedsFilter_SSE2(p1, p0, q0, q1, thresh, &filter_mask);
  *mask = _mm_and_si128(thresh_mask, filter_mask);
}